

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O3

uint4 __thiscall GrammarLexer::moveState(GrammarLexer *this,char lookahead)

{
  uint4 uVar1;
  uint4 uVar2;
  byte bVar3;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  if (lookahead < ' ') {
    if (4 < (byte)(lookahead - 9U)) {
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Illegal character","");
      std::__cxx11::string::_M_assign((string *)&this->error);
      goto LAB_0033a424;
    }
    bVar3 = 2 >> (lookahead - 9U & 0x1f);
    lookahead = ' ';
  }
  else {
    if (lookahead == '\x7f') {
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Illegal character","");
      std::__cxx11::string::_M_assign((string *)&this->error);
      goto LAB_0033a424;
    }
    bVar3 = 0;
  }
  uVar1 = 0;
  uVar2 = 0;
  switch(this->state) {
  case 0:
    uVar2 = uVar1;
    switch(lookahead) {
    case ' ':
      goto switchD_0033a45f_default;
    default:
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Illegal character","");
      std::__cxx11::string::_M_assign((string *)&this->error);
      goto LAB_0033a424;
    case '\"':
      this->state = 8;
      break;
    case '\'':
      goto switchD_0033a45f_caseD_c;
    case '(':
    case ')':
    case '*':
    case ',':
    case ';':
    case '=':
    case '[':
    case ']':
    case '{':
    case '}':
      this->state = 5;
      break;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      this->state = 0xd;
      break;
    case '.':
      this->state = 2;
      goto switchD_0033a45f_default;
    case '/':
      this->state = 1;
      goto switchD_0033a45f_default;
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '_':
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
      this->state = 0xe;
    }
    this->bufstart = this->bufend + -1;
    break;
  case 1:
    if (lookahead == '/') {
      this->state = 6;
      uVar2 = uVar1;
    }
    else {
      if (lookahead != '*') goto LAB_0033a5fe;
      this->state = 7;
      uVar2 = uVar1;
    }
    break;
  case 2:
    if (lookahead != '.') {
LAB_0033a5fe:
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Syntax error","");
      std::__cxx11::string::_M_assign((string *)&this->error);
LAB_0033a424:
      if (local_30[0] != local_20) {
        operator_delete(local_30[0]);
      }
      return 0x100;
    }
    this->state = 3;
    uVar2 = uVar1;
    break;
  case 3:
    if (lookahead != '.') goto LAB_0033a5fe;
    this->state = 4;
    uVar2 = uVar1;
    break;
  case 4:
    this->state = 0;
    uVar2 = 0x102;
    break;
  case 5:
    this->state = 0;
    uVar2 = (int)this->buffer[this->bufstart];
    break;
  case 6:
    if ((bVar3 & 1) == 0) {
      return 0;
    }
    this->state = 0;
    uVar2 = 0;
    goto LAB_0033a6f5;
  case 7:
    uVar2 = uVar1;
    if (((lookahead == '/') && (1 < (long)this->bufend)) &&
       (this->buffer[(long)this->bufend + -2] == '*')) {
      this->state = 0;
    }
    break;
  case 8:
    uVar2 = uVar1;
    if (lookahead == '\"') {
      this->state = 9;
    }
    break;
  case 9:
    this->state = 0;
    uVar2 = 0x106;
    break;
  case 10:
    if (lookahead == '\'') {
      this->state = 0xb;
      uVar2 = uVar1;
    }
    else {
      uVar2 = uVar1;
      if (lookahead == '\\') {
        this->state = 0xc;
      }
    }
    break;
  case 0xb:
    this->state = 0;
    uVar2 = 0x104;
    break;
  case 0xc:
switchD_0033a45f_caseD_c:
    this->state = 10;
    uVar2 = uVar1;
    break;
  case 0xd:
    if (lookahead == 'x') {
      if ((this->bufend - this->bufstart != 2) ||
         (uVar2 = uVar1, this->buffer[this->bufstart] != '0')) goto LAB_0033a5fe;
    }
    else {
      uVar2 = uVar1;
      if ((0x19 < (byte)(lookahead + 0xbfU) && 9 < (byte)(lookahead - 0x30U)) &&
         (lookahead != '_' && 0x19 < (byte)(lookahead + 0x9fU))) {
        this->state = 0;
        uVar2 = 0x103;
      }
    }
    break;
  case 0xe:
    uVar2 = uVar1;
    if ((0x19 < (byte)(lookahead + 0xbfU) && 9 < (byte)(lookahead - 0x30U)) &&
       (lookahead != '_' && 0x19 < (byte)(lookahead + 0x9fU))) {
      this->state = 0;
      uVar2 = 0x105;
    }
  }
switchD_0033a45f_default:
  if ((bVar3 & 1) != 0) {
LAB_0033a6f5:
    this->curlineno = this->curlineno + 1;
    this->bufstart = 0;
    this->bufend = 0;
  }
  return uVar2;
}

Assistant:

uint4 GrammarLexer::moveState(char lookahead)

{ // Change finite state machine based on lookahead
  uint4 res;
  bool newline = false;

  if (lookahead<32) {
    if ((lookahead == 9)||(lookahead==11)||(lookahead==12)||
	(lookahead==13))
      lookahead = ' ';
    else if (lookahead == '\n') {
      newline = true;
      lookahead = ' ';
    }
    else {
      setError("Illegal character");
      return GrammarToken::badtoken;
    }
  }
  else if (lookahead >= 127) {
    setError("Illegal character");
    return GrammarToken::badtoken;
  }

  res = 0;
  bool syntaxerror = false;
  switch(state) {
  case start:
    switch(lookahead) {
    case '/':
      state = slash;
      break;
    case '.':
      state = dot1;
      break;
    case '*':
    case ',':
    case '(':
    case ')':
    case '[':
    case ']':
    case '{':
    case '}':
    case ';':
    case '=':
      state = punctuation;
      bufstart = bufend-1;
      break;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      state = number;
      bufstart = bufend-1;
      break;
    case ' ':
      break;			// Ignore since we are already open
    case '\"':
      state = doublequote;
      bufstart = bufend-1;
      break;
    case '\'':
      state = singlequote;
      break;
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '_':
      state = identifier;
      bufstart = bufend-1;
      break;
    default:
      setError("Illegal character");
      return GrammarToken::badtoken;
    }
    break;
  case slash:
    if (lookahead=='*')
      state = c_comment;
    else if (lookahead == '/')
      state = endofline_comment;
    else
      syntaxerror = true;
    break;
  case dot1:
    if (lookahead=='.')
      state = dot2;
    else
      syntaxerror = true;
    break;
  case dot2:
    if (lookahead=='.')
      state = dot3;
    else
      syntaxerror = true;
    break;
  case dot3:
    state = start;
    res = GrammarToken::dotdotdot;
    break;
  case punctuation:
    state = start;
    res = (uint4)buffer[bufstart];
    break;
  case endofline_comment:
    if (newline)
      state = start;
    break;			// Anything else is part of comment
  case c_comment:
    if (lookahead == '/') {
      if ((bufend >1)&&(buffer[bufend-2]=='*'))
	state = start;
    }
    break;			// Anything else is part of comment
  case doublequote:
    if (lookahead == '\"')
      state = doublequoteend;
    break;			// Anything else is part of string
  case doublequoteend:
    state = start;
    res = GrammarToken::stringval;
    break;
  case singlequote:
    if (lookahead == '\\')
      state = singlebackslash;
    else if (lookahead == '\'')
      state = singlequoteend;
    break;			// Anything else is part of string
  case singlequoteend:
    state = start;
    res = GrammarToken::charconstant;
    break;
  case singlebackslash:	// Seen backslash in a single quoted string
    state = singlequote;
    break;
  case number:
    if (lookahead=='x') {
      if (((bufend-bufstart)!=2)||(buffer[bufstart]!='0'))
	syntaxerror = true;	// x only allowed as 0x hex indicator
    }
    else if ((lookahead>='0')&&(lookahead<='9')) {
    }
    else if ((lookahead>='A')&&(lookahead<='Z')) {
    }
    else if ((lookahead>='a')&&(lookahead<='z')) {
    }
    else if (lookahead == '_') {
    }
    else {
      state = start;
      res = GrammarToken::integer;
    }
    break;
  case identifier:
    if ((lookahead>='0')&&(lookahead<='9')) {
    }
    else if ((lookahead>='A')&&(lookahead<='Z')) {
    }
    else if ((lookahead>='a')&&(lookahead<='z')) {
    }
    else if (lookahead == '_') {
    }
    else {
      state = start;
      res = GrammarToken::identifier;
    }
    break;
  }
  if (syntaxerror) {
    setError("Syntax error");
    return GrammarToken::badtoken;
  }
  if (newline) bumpLine();
  return res;
}